

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::Matcher::Matcher(Matcher *this,Matcher *other)

{
  Matcher *other_local;
  Matcher *this_local;
  
  std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>::
  unordered_set(&this->shortFlags,&other->shortFlags);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::unordered_set(&this->longFlags,&other->longFlags);
  return;
}

Assistant:

Matcher(Matcher &&other) noexcept : shortFlags(std::move(other.shortFlags)), longFlags(std::move(other.longFlags))
            {}